

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  Vdbe *pVVar4;
  int iVar5;
  Vdbe *pVm;
  char **p;
  char *pcVar6;
  uchar *puVar7;
  Mem *pMVar8;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  long in_FS_OFFSET;
  sqlite3_stmt *pStmt;
  int local_70;
  uint local_6c;
  Vdbe *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (Vdbe *)0x0;
  iVar5 = sqlite3SafetyCheckOk(db);
  if (iVar5 == 0) {
    iVar5 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x21835,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    goto LAB_001229e6;
  }
  pcVar6 = "";
  if (zSql != (char *)0x0) {
    pcVar6 = zSql;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  db->errCode = 0;
  if (db->pErr == (sqlite3_value *)0x0) {
    db->errByteOffset = -1;
  }
  else {
    sqlite3ErrorFinish(db,0);
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  while( true ) {
    if (*pcVar6 == '\0') break;
    local_48 = (Vdbe *)0x0;
    local_70 = sqlite3LockAndPrepare
                         (db,pcVar6,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_48,&local_40);
    if (local_70 != 0) goto LAB_0012294a;
    if (local_48 == (Vdbe *)0x0) {
      local_70 = 0;
      pcVar6 = local_40;
    }
    else {
      p = (char **)0x0;
      bVar3 = false;
      local_6c = 0;
      ppcVar11 = (char **)0x0;
      do {
        local_70 = sqlite3_step((sqlite3_stmt *)local_48);
        if (xCallback != (sqlite3_callback)0x0) {
          if (local_70 == 100) {
            if (!bVar3) goto LAB_0012277f;
LAB_001227ed:
            uVar10 = (ulong)local_6c;
            ppcVar11 = p + uVar10;
            if (local_6c == 0) {
              uVar10 = 0;
            }
            else {
              uVar9 = 0;
              do {
                puVar7 = sqlite3_column_text((sqlite3_stmt *)local_48,(int)uVar9);
                pVVar4 = local_48;
                ppcVar11[uVar9] = (char *)puVar7;
                if (puVar7 == (uchar *)0x0) {
                  pMVar8 = columnMem((sqlite3_stmt *)local_48,(int)uVar9);
                  uVar2._0_2_ = pMVar8->flags;
                  uVar2._2_1_ = pMVar8->enc;
                  uVar2._3_1_ = pMVar8->eSubtype;
                  columnMallocFailure((sqlite3_stmt *)pVVar4);
                  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
                    sqlite3OomFault(db);
                    local_70 = 100;
                    goto LAB_00122952;
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            ppcVar11[uVar10] = (char *)0x0;
          }
          else {
            if (((local_70 != 0x65) || (bVar3)) || ((db->flags & 0x100) == 0)) break;
LAB_0012277f:
            if (local_48 == (Vdbe *)0x0) {
              local_6c = 0;
            }
            else {
              local_6c = (uint)local_48->nResColumn;
            }
            p = (char **)sqlite3DbMallocRawNN(db,(ulong)(local_6c << 4 | 8));
            pVVar4 = local_48;
            if (p == (char **)0x0) goto LAB_0012294a;
            if (local_6c != 0) {
              uVar10 = 0;
              do {
                pcVar6 = (char *)columnName((sqlite3_stmt *)pVVar4,(int)uVar10,0,0);
                p[uVar10] = pcVar6;
                uVar10 = uVar10 + 1;
              } while (local_6c != uVar10);
            }
            if (local_70 == 100) goto LAB_001227ed;
          }
          iVar5 = (*xCallback)(pArg,local_6c,ppcVar11,p);
          bVar3 = true;
          if (iVar5 != 0) {
            sqlite3VdbeFinalize(local_48);
            local_48 = (Vdbe *)0x0;
            db->errCode = 4;
            local_70 = 4;
            sqlite3ErrorFinish(db,4);
            goto LAB_00122952;
          }
        }
      } while (local_70 == 100);
      local_70 = sqlite3VdbeFinalize(local_48);
      local_48 = (Vdbe *)0x0;
      pcVar6 = local_40 + -1;
      do {
        pbVar1 = (byte *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 1;
      } while ((""[*pbVar1] & 1) != 0);
      if (p != (char **)0x0) {
        sqlite3DbFreeNN(db,p);
      }
    }
    if (local_70 != 0) goto LAB_0012294a;
  }
  local_70 = 0;
LAB_0012294a:
  p = (char **)0x0;
LAB_00122952:
  if (local_48 != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(local_48);
  }
  if (p != (char **)0x0) {
    sqlite3DbFreeNN(db,p);
  }
  if ((local_70 == 0) && (db->mallocFailed == '\0')) {
    iVar5 = 0;
LAB_00122982:
    if (pzErrMsg != (char **)0x0) {
      *pzErrMsg = (char *)0x0;
    }
  }
  else {
    iVar5 = apiHandleError(db,local_70);
    if ((pzErrMsg == (char **)0x0) || (iVar5 == 0)) goto LAB_00122982;
    pcVar6 = sqlite3_errmsg(db);
    pcVar6 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar6);
    *pzErrMsg = pcVar6;
    if (pcVar6 == (char *)0x0) {
      db->errCode = 7;
      iVar5 = 7;
      sqlite3ErrorFinish(db,7);
    }
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
LAB_001229e6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}